

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O1

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  this->object_fns_ = other->object_fns_;
  this->target_fns_ = other->target_fns_;
  other->object_fns_ =
       (object_fns *)
       object_fns_table<void>(std::enable_if<is_same<void,void>::value,void>::type*)::fns;
  other->target_fns_ =
       (target_fns *)
       target_fns_table<void>(std::enable_if<is_same<void,void>::value,void>::type*)::fns;
  (*this->object_fns_->move)(this,other);
  other->target_ = (void *)0x0;
  return;
}

Assistant:

any_executor_base(any_executor_base&& other) ASIO_NOEXCEPT
    : object_fns_(other.object_fns_),
      target_fns_(other.target_fns_)
  {
    other.object_fns_ = object_fns_table<void>();
    other.target_fns_ = target_fns_table<void>();
    object_fns_->move(*this, other);
    other.target_ = 0;
  }